

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# info.h
# Opt level: O3

void __thiscall bandit::reporter::info::list_failures_and_errors(info *this)

{
  list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *plVar1;
  ostream *poVar2;
  _List_node_base *p_Var3;
  long *local_70;
  long local_68;
  long local_60 [2];
  long *local_50;
  long local_48;
  long local_40 [2];
  
  if (0 < (this->super_colored_base).super_progress_base.specs_failed_) {
    poVar2 = (this->super_colored_base).stm_;
    (*((this->super_colored_base).colorizer_)->_vptr_interface[5])(&local_70);
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>(poVar2,(char *)local_70,local_68);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"List of failures:",0x11);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
    std::ostream::put((char)poVar2);
    std::ostream::flush();
    if (local_70 != local_60) {
      operator_delete(local_70,local_60[0] + 1);
    }
    plVar1 = &(this->super_colored_base).super_progress_base.failures_;
    p_Var3 = (this->super_colored_base).super_progress_base.failures_.
             super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl._M_node.super__List_node_base._M_next;
    if (p_Var3 != (_List_node_base *)plVar1) {
      do {
        poVar2 = (this->super_colored_base).stm_;
        (*((this->super_colored_base).colorizer_)->_vptr_interface[6])(&local_70);
        poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar2,(char *)local_70,local_68);
        std::__ostream_insert<char,std::char_traits<char>>(poVar2," (*) ",5);
        (*((this->super_colored_base).colorizer_)->_vptr_interface[5])(&local_50);
        poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar2,(char *)local_50,local_48);
        poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar2,(char *)p_Var3[1]._M_next,(long)p_Var3[1]._M_prev);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
        std::ostream::put((char)poVar2);
        std::ostream::flush();
        if (local_50 != local_40) {
          operator_delete(local_50,local_40[0] + 1);
        }
        if (local_70 != local_60) {
          operator_delete(local_70,local_60[0] + 1);
        }
        p_Var3 = p_Var3->_M_next;
      } while (p_Var3 != (_List_node_base *)plVar1);
    }
  }
  if ((this->super_colored_base).super_progress_base.test_run_errors_.
      super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl._M_node._M_size != 0) {
    poVar2 = (this->super_colored_base).stm_;
    (*((this->super_colored_base).colorizer_)->_vptr_interface[5])(&local_70);
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>(poVar2,(char *)local_70,local_68);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"List of run errors:",0x13);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
    std::ostream::put((char)poVar2);
    std::ostream::flush();
    plVar1 = &(this->super_colored_base).super_progress_base.test_run_errors_;
    if (local_70 != local_60) {
      operator_delete(local_70,local_60[0] + 1);
    }
    p_Var3 = (plVar1->
             super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl._M_node.super__List_node_base._M_next;
    if (p_Var3 != (_List_node_base *)plVar1) {
      do {
        poVar2 = (this->super_colored_base).stm_;
        (*((this->super_colored_base).colorizer_)->_vptr_interface[6])(&local_70);
        poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar2,(char *)local_70,local_68);
        std::__ostream_insert<char,std::char_traits<char>>(poVar2," (*) ",5);
        (*((this->super_colored_base).colorizer_)->_vptr_interface[5])(&local_50);
        poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar2,(char *)local_50,local_48);
        poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar2,(char *)p_Var3[1]._M_next,(long)p_Var3[1]._M_prev);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
        std::ostream::put((char)poVar2);
        std::ostream::flush();
        if (local_50 != local_40) {
          operator_delete(local_50,local_40[0] + 1);
        }
        if (local_70 != local_60) {
          operator_delete(local_70,local_60[0] + 1);
        }
        p_Var3 = p_Var3->_M_next;
      } while (p_Var3 != (_List_node_base *)plVar1);
    }
  }
  return;
}

Assistant:

void list_failures_and_errors() {
        if (specs_failed_ > 0) {
          stm_
              << colorizer_.bad()
              << "List of failures:"
              << std::endl;
          for (const auto& failure : failures_) {
            stm_
                << colorizer_.emphasize()
                << " (*) "
                << colorizer_.bad()
                << failure << std::endl;
          }
        }
        if (test_run_errors_.size() > 0) {
          stm_
              << colorizer_.bad()
              << "List of run errors:"
              << std::endl;
          for (const auto& error : test_run_errors_) {
            stm_
                << colorizer_.emphasize()
                << " (*) "
                << colorizer_.bad()
                << error << std::endl;
          }
        }
      }